

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_Warp(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                    VMReturn *ret,int numret)

{
  void *pvVar1;
  int iVar2;
  DObject *this;
  bool bVar3;
  int iVar4;
  VMValue *pVVar5;
  PClassActor *pPVar6;
  AActor *reference;
  char *pcVar7;
  uint flags;
  AActor *defactor;
  double heightoffset;
  double radiusoffset;
  FState *local_88;
  void *local_78;
  void *local_70;
  void *local_68;
  void *local_60;
  DAngle local_40;
  DAngle local_38;
  
  if (numparam < 1) {
LAB_003eb7ec:
    pcVar7 = "(paramnum) < numparam";
    goto LAB_003eb7fc;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    defactor = *(AActor **)&param->field_0;
    if ((param->field_0).field_1.atag == 1) {
      if (defactor == (AActor *)0x0) {
LAB_003eb40b:
        defactor = (AActor *)0x0;
      }
      else {
        bVar3 = DObject::IsKindOf((DObject *)defactor,AActor::RegistrationInfo.MyClass);
        if (!bVar3) {
          pcVar7 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003eb7fc;
        }
      }
      if (numparam == 1) goto LAB_003eb7ec;
      if (param[1].field_0.field_3.Type == '\x03') {
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar3 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar3) {
              pcVar7 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_003eb7fc;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_003eb7e3;
        if ((uint)numparam < 3) goto LAB_003eb7ec;
        if (param[2].field_0.field_3.Type != '\x03') {
          pcVar7 = "param[paramnum].Type == REGT_POINTER";
          goto LAB_003eb7fc;
        }
        if (numparam == 3) {
          pcVar7 = "(paramnum) < numparam";
LAB_003eb824:
          __assert_fail(pcVar7,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1528,
                        "int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
        }
        if (param[3].field_0.field_3.Type != '\0') {
          pcVar7 = "param[paramnum].Type == REGT_INT";
          goto LAB_003eb824;
        }
        iVar4 = param[3].field_0.i;
        if ((uint)numparam < 5) {
          pVVar5 = defaultparam->Array;
          if (pVVar5[4].field_0.field_3.Type != '\x01') {
            pcVar7 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
            goto LAB_003eb92e;
          }
          local_60 = pVVar5[4].field_0.field_1.a;
LAB_003eb4ce:
          if (pVVar5[5].field_0.field_3.Type != '\x01') {
            pcVar7 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003eb94d:
            __assert_fail(pcVar7,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x152a,
                          "int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          local_70 = pVVar5[5].field_0.field_1.a;
LAB_003eb4dd:
          if (pVVar5[6].field_0.field_3.Type != '\x01') {
            pcVar7 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003eb8fd:
            __assert_fail(pcVar7,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x152b,
                          "int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          local_78 = pVVar5[6].field_0.field_1.a;
LAB_003eb4ec:
          if (pVVar5[7].field_0.field_3.Type != '\x01') {
            pcVar7 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003eb8de:
            __assert_fail(pcVar7,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x152c,
                          "int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          local_68 = pVVar5[7].field_0.field_1.a;
LAB_003eb501:
          if (pVVar5[8].field_0.field_3.Type != '\0') {
            pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003eb8bf:
            __assert_fail(pcVar7,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x152d,
                          "int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          flags = pVVar5[8].field_0.i;
LAB_003eb515:
          if (pVVar5[9].field_0.field_3.Type != '\0') {
            pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003eb8a0:
            __assert_fail(pcVar7,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x152e,
                          "int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          iVar2 = pVVar5[9].field_0.i;
          pPVar6 = (PClassActor *)DObject::GetClass((DObject *)defactor);
          local_88 = FStateLabelStorage::GetState(&StateLabels,iVar2,pPVar6,false);
LAB_003eb554:
          param = defaultparam->Array;
          if (param[10].field_0.field_3.Type != '\x01') {
            pcVar7 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003eb881:
            __assert_fail(pcVar7,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x152f,
                          "int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          heightoffset = param[10].field_0.f;
LAB_003eb56f:
          if (param[0xb].field_0.field_3.Type != '\x01') {
            pcVar7 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003eb862:
            __assert_fail(pcVar7,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x1530,
                          "int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          radiusoffset = param[0xb].field_0.f;
LAB_003eb586:
          if (param[0xc].field_0.field_3.Type != '\x01') {
            pcVar7 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003eb843:
            __assert_fail(pcVar7,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x1531,
                          "int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
        }
        else {
          if (param[4].field_0.field_3.Type != '\x01') {
            pcVar7 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003eb92e:
            __assert_fail(pcVar7,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x1529,
                          "int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          local_60 = (void *)param[4].field_0.f;
          if (numparam == 5) {
            pVVar5 = defaultparam->Array;
            goto LAB_003eb4ce;
          }
          if (param[5].field_0.field_3.Type != '\x01') {
            pcVar7 = "(param[paramnum]).Type == REGT_FLOAT";
            goto LAB_003eb94d;
          }
          local_70 = (void *)param[5].field_0.f;
          if ((uint)numparam < 7) {
            pVVar5 = defaultparam->Array;
            goto LAB_003eb4dd;
          }
          if (param[6].field_0.field_3.Type != '\x01') {
            pcVar7 = "(param[paramnum]).Type == REGT_FLOAT";
            goto LAB_003eb8fd;
          }
          local_78 = (void *)param[6].field_0.f;
          if (numparam == 7) {
            pVVar5 = defaultparam->Array;
            goto LAB_003eb4ec;
          }
          if (param[7].field_0.field_3.Type != '\x01') {
            pcVar7 = "(param[paramnum]).Type == REGT_FLOAT";
            goto LAB_003eb8de;
          }
          local_68 = param[7].field_0.field_1.a;
          if ((uint)numparam < 9) {
            pVVar5 = defaultparam->Array;
            goto LAB_003eb501;
          }
          if (param[8].field_0.field_3.Type != '\0') {
            pcVar7 = "(param[paramnum]).Type == REGT_INT";
            goto LAB_003eb8bf;
          }
          flags = param[8].field_0.i;
          if (numparam == 9) {
            pVVar5 = defaultparam->Array;
            goto LAB_003eb515;
          }
          if (param[9].field_0.field_3.Type != '\0') {
            pcVar7 = "(param[paramnum]).Type == REGT_INT";
            goto LAB_003eb8a0;
          }
          iVar2 = param[9].field_0.i;
          pPVar6 = (PClassActor *)DObject::GetClass((DObject *)defactor);
          local_88 = FStateLabelStorage::GetState(&StateLabels,iVar2,pPVar6,false);
          if ((uint)numparam < 0xb) goto LAB_003eb554;
          if (param[10].field_0.field_3.Type != '\x01') {
            pcVar7 = "(param[paramnum]).Type == REGT_FLOAT";
            goto LAB_003eb881;
          }
          heightoffset = param[10].field_0.f;
          if (numparam == 0xb) {
            param = defaultparam->Array;
            goto LAB_003eb56f;
          }
          if (param[0xb].field_0.field_3.Type != '\x01') {
            pcVar7 = "(param[paramnum]).Type == REGT_FLOAT";
            goto LAB_003eb862;
          }
          radiusoffset = param[0xb].field_0.f;
          if ((uint)numparam < 0xd) {
            param = defaultparam->Array;
            goto LAB_003eb586;
          }
          if (param[0xc].field_0.field_3.Type != '\x01') {
            pcVar7 = "(param[paramnum]).Type == REGT_FLOAT";
            goto LAB_003eb843;
          }
        }
        pvVar1 = param[0xc].field_0.field_1.a;
        if (numret < 2) {
          if (numret != 1) {
            bVar3 = false;
            goto LAB_003eb625;
          }
          numret = 1;
        }
        else {
          VMReturn::SetInt(ret + 1,0);
          numret = 2;
        }
        VMReturn::SetPointer(ret,(void *)0x0,0);
        bVar3 = true;
LAB_003eb625:
        if ((flags >> 0xd & 1) == 0) {
          reference = COPY_AAPTR(defactor,iVar4);
        }
        else {
          reference = SingleActorFromTID(iVar4,defactor);
        }
        if (reference != (AActor *)0x0) {
          local_38.Degrees = (double)local_68;
          local_40.Degrees = (double)pvVar1;
          iVar4 = P_Thing_Warp(defactor,reference,(double)local_60,(double)local_70,(double)local_78
                               ,&local_38,flags,heightoffset,radiusoffset,&local_40);
          if (iVar4 != 0) {
            if (local_88 == (FState *)0x0) {
              if (1 < numret) {
                VMReturn::SetInt(ret + 1,1);
              }
            }
            else if (bVar3) {
              VMReturn::SetPointer(ret,local_88,0);
            }
          }
        }
        return numret;
      }
    }
    else if (defactor == (AActor *)0x0) goto LAB_003eb40b;
  }
LAB_003eb7e3:
  pcVar7 = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_003eb7fc:
  __assert_fail(pcVar7,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x1527,"int AF_AActor_A_Warp(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Warp)
{
	PARAM_ACTION_PROLOGUE(AActor);
	PARAM_INT(destination_selector);
	PARAM_FLOAT_DEF(xofs)				
	PARAM_FLOAT_DEF(yofs)				
	PARAM_FLOAT_DEF(zofs)				
	PARAM_ANGLE_DEF(angle)				
	PARAM_INT_DEF(flags)				
	PARAM_STATE_DEF(success_state)		
	PARAM_FLOAT_DEF(heightoffset)		
	PARAM_FLOAT_DEF(radiusoffset)		
	PARAM_ANGLE_DEF(pitch)				
	
	AActor *reference;

	// A_Teleport and A_Warp were the only codepointers that can state jump
	// *AND* have a meaningful inventory state chain result. Grrr.
	if (numret > 1)
	{
		ret[1].SetInt(false);
		numret = 2;
	}
	if (numret > 0)
	{
		ret[0].SetPointer(NULL, ATAG_STATE);
	}

	if ((flags & WARPF_USETID))
	{
		reference = SingleActorFromTID(destination_selector, self);
	}
	else
	{
		reference = COPY_AAPTR(self, destination_selector);
	}

	//If there is no actor to warp to, fail.
	if (!reference)
	{
		return numret;
	}

	if (P_Thing_Warp(self, reference, xofs, yofs, zofs, angle, flags, heightoffset, radiusoffset, pitch))
	{
		if (success_state)
		{
			// Jumps should never set the result for inventory state chains!
			// in this case, you have the statejump to help you handle all the success anyway.
			if (numret > 0)
			{
				ret[0].SetPointer(success_state, ATAG_STATE);
			}
		}
		else if (numret > 1)
		{
			ret[1].SetInt(true);
		}
	}
	return numret;
}